

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guarded_optTests.cpp
# Opt level: O0

void __thiscall guarded_opt_guarded_2_Test::TestBody(guarded_opt_guarded_2_Test *this)

{
  bool bVar1;
  int *lhs;
  char *message;
  AssertHelper local_c0;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar;
  handle data_handle;
  type local_70;
  thread local_68;
  thread th2;
  thread local_58;
  thread th1;
  undefined1 local_48 [8];
  guarded_opt<int,_std::mutex> data;
  guarded_opt_guarded_2_Test *this_local;
  
  th1._M_id._M_thread._4_4_ = 0;
  data._48_8_ = this;
  gmlc::libguarded::guarded_opt<int,_std::mutex>::guarded_opt<int>
            ((guarded_opt<int,_std::mutex> *)local_48,true,(int *)((long)&th1._M_id._M_thread + 4));
  th2._M_id._M_thread = (id)(id)local_48;
  std::thread::thread<guarded_opt_guarded_2_Test::TestBody()::__0,,void>(&local_58,(type *)&th2);
  local_70.data = (guarded_opt<int,_std::mutex> *)local_48;
  std::thread::thread<guarded_opt_guarded_2_Test::TestBody()::__1,,void>(&local_68,&local_70);
  std::thread::join();
  std::thread::join();
  gmlc::libguarded::guarded_opt<int,_std::mutex>::lock
            ((handle *)&gtest_ar.message_,(guarded_opt<int,_std::mutex> *)local_48);
  lhs = gmlc::libguarded::lock_handle<int,_std::mutex>::operator*
                  ((lock_handle<int,_std::mutex> *)&gtest_ar.message_);
  local_ac = 20000;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a8,"*data_handle","20000",lhs,&local_ac);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_b8);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/GMLC-TDC[P]concurrency/tests/libguarded/guarded_optTests.cpp"
               ,0x6d,message);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    testing::Message::~Message(&local_b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  gmlc::libguarded::lock_handle<int,_std::mutex>::~lock_handle
            ((lock_handle<int,_std::mutex> *)&gtest_ar.message_);
  std::thread::~thread(&local_68);
  std::thread::~thread(&local_58);
  return;
}

Assistant:

TEST(guarded_opt, guarded_2)
{
    guarded_opt<int> data(true, 0);

    std::thread th1([&data]() {
        for (int i = 0; i < 10000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    std::thread th2([&data]() {
        for (int i = 0; i < 10000; ++i) {
            auto data_handle = data.lock();
            ++(*data_handle);
        }
    });

    th1.join();
    th2.join();

    auto data_handle = data.lock();

    EXPECT_EQ(*data_handle, 20000);
}